

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextFile.cpp
# Opt level: O3

Array<asl::String> __thiscall asl::TextFile::lines(TextFile *this)

{
  FILE *pFVar1;
  bool bVar2;
  int iVar3;
  File *in_RSI;
  String local_30;
  
  Array<asl::String>::alloc((Array<asl::String> *)this,0);
  if ((in_RSI->_file == (FILE *)0x0) &&
     (iVar3 = File::open(in_RSI,(char *)&in_RSI->_path,8),
     ((byte)iVar3 & in_RSI->_file != (FILE *)0x0) == 0)) {
    return (Array<asl::String>)(String *)this;
  }
  while (bVar2 = end((TextFile *)in_RSI), !bVar2) {
    local_30.field_2._space[0] = '\0';
    local_30._size = 0;
    local_30._len = 0;
    Array<asl::String>::insert((Array<asl::String> *)this,-1,&local_30);
    if (local_30._size != 0) {
      free((void *)CONCAT71(local_30.field_2._1_7_,local_30.field_2._space[0]));
    }
    pFVar1 = (this->super_File)._file;
    readLine((TextFile *)in_RSI,(String *)(pFVar1 + (long)*(int *)(pFVar1 + -0x10) * 0x18 + -0x18));
  }
  return (Array<asl::String>)(String *)this;
}

Assistant:

Array<String> TextFile::lines()
{
	Array<String> lines;
	if(!_file && !open(READ))
		return lines;
	while (!end()) {
		lines << String();
		readLine(lines.last());
	}
	return lines;
}